

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall
kj::(anonymous_namespace)::AppendableFileImpl::~AppendableFileImpl(AppendableFileImpl *this)

{
  long *plVar1;
  
  plVar1 = *(long **)(this + 0x10);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)(this + 0x10) = 0;
    (**(code **)**(undefined8 **)(this + 8))
              (*(undefined8 **)(this + 8),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)this);
  operator_delete(this + -8,0x20);
  return;
}

Assistant:

AppendableFileImpl(Own<const File>&& fileParam): file(kj::mv(fileParam)) {}